

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Tools.h
# Opt level: O2

void check<std::__cxx11::string&>
               (bool condition,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *t1
               )

{
  runtime_error *this;
  undefined7 in_register_00000039;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_R9;
  string_view delimiter;
  string sStack_38;
  
  if ((int)CONCAT71(in_register_00000039,condition) != 0) {
    return;
  }
  this = (runtime_error *)__cxa_allocate_exception(0x10);
  delimiter._M_str = "";
  delimiter._M_len = (size_t)"";
  str::concat<char_const(&)[1],std::__cxx11::string&>
            (&sStack_38,(str *)0x0,delimiter,(char (*) [1])t1,in_R9);
  std::runtime_error::runtime_error(this,(string *)&sStack_38);
  __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void check(bool condition, T1&& t1, T2&&... t2) {
    if (!condition) {
        throw std::runtime_error(str::concat("", "", std::forward<T1>(t1), std::forward<T2>(t2)...));
    }
}